

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

void __thiscall
irr::core::string<unsigned_short>::append
          (string<unsigned_short> *this,string<unsigned_short> *other)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = this->used;
  this->used = iVar1 + -1;
  uVar2 = other->used;
  if (this->allocated <= (int)(uVar2 + iVar1 + -2)) {
    reallocate(this,uVar2 + iVar1 + -1);
  }
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      this->array[(long)this->used + uVar3] = other->array[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  this->used = this->used + uVar2;
  return;
}

Assistant:

void append(const string<T>& other)
	{
		--used;

		s32 len = other.size();
		
		if (used + len + 1 > allocated)
			reallocate((s32)used + (s32)len + 1);

		for (s32 l=0; l<len+1; ++l)
			array[l+used] = other[l];

		used = used + len + 1;
	}